

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

bool IR::Instr::HasSymUseDst(StackSym *sym,Opnd *dst)

{
  code *pcVar1;
  OpndKind OVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  ListOpndType *dst_00;
  StackSym *pSVar6;
  PropertySymOpnd *this;
  int i;
  
  if (dst == (Opnd *)0x0) {
    return false;
  }
  OVar2 = Opnd::GetKind(dst);
  OVar3 = Opnd::GetKind(dst);
  if (OVar2 == OpndKindIndir) {
    if (OVar3 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar4) goto LAB_004b8e5f;
      *puVar5 = 0;
    }
    if ((dst[1]._vptr_Opnd != (_func_int **)0x0) && ((StackSym *)dst[1]._vptr_Opnd[2] == sym)) {
      return true;
    }
    if (*(long *)&dst[1].m_valueType == 0) {
      return false;
    }
    pSVar6 = *(StackSym **)(*(long *)&dst[1].m_valueType + 0x10);
  }
  else {
    OVar2 = Opnd::GetKind(dst);
    if (OVar3 == OpndKindList) {
      if (OVar2 != OpndKindList) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1a4,"(this->IsListOpnd())","Bad call to AsListOpnd()");
        if (!bVar4) goto LAB_004b8e5f;
        *puVar5 = 0;
      }
      i = 0;
      if (*(int *)&dst[1]._vptr_Opnd < 1) {
        return false;
      }
      do {
        dst_00 = ListOpnd::Item((ListOpnd *)dst,i);
        bVar4 = HasSymUseDst(sym,&dst_00->super_Opnd);
        if (bVar4) {
          return bVar4;
        }
        i = i + 1;
      } while (i < *(int *)&dst[1]._vptr_Opnd);
      return bVar4;
    }
    if (OVar2 != OpndKindSym) {
      return false;
    }
    OVar2 = Opnd::GetKind(dst);
    if (OVar2 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) {
LAB_004b8e5f:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    pSVar6 = (StackSym *)Opnd::GetSym(dst);
    if (pSVar6 == sym) {
      return true;
    }
    bVar4 = SymOpnd::IsPropertySymOpnd((SymOpnd *)dst);
    if (!bVar4) {
      return false;
    }
    this = Opnd::AsPropertySymOpnd(dst);
    pSVar6 = PropertySymOpnd::GetObjectSym(this);
  }
  if (pSVar6 != sym) {
    return false;
  }
  return true;
}

Assistant:

bool
Instr::HasSymUseDst(StackSym *sym, IR::Opnd* dst)
{
    if (!dst)
    {
        return false;
    }
    if (dst->IsIndirOpnd())
    {
        IR::IndirOpnd *indirOpnd = dst->AsIndirOpnd();
        RegOpnd * baseOpnd = indirOpnd->GetBaseOpnd();
        if (baseOpnd != nullptr && baseOpnd->m_sym == sym)
        {
            return true;
        }
        else if (indirOpnd->GetIndexOpnd() && indirOpnd->GetIndexOpnd()->m_sym == sym)
        {
            return true;
        }
    }
    else if (dst->IsListOpnd())
    {
        IR::ListOpnd* list = dst->AsListOpnd();
        for (int i = 0; i < list->Count(); ++i)
        {
            if (HasSymUseDst(sym, list->Item(i)))
            {
                return true;
            }
        }
    }
    else if (dst->IsSymOpnd())
    {
        SymOpnd* symOpnd = dst->AsSymOpnd();
        if (symOpnd->GetSym() == sym)
        {
            return true;
        }
        if (symOpnd->IsPropertySymOpnd())
        {
            PropertySymOpnd* propertySymOpnd = symOpnd->AsPropertySymOpnd();
            if (propertySymOpnd->GetObjectSym() == sym)
            {
                return true;
            }
        }
    }
    return false;
}